

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::
moveFromSpan(Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *this
            ,Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
             *fromSpan,size_t fromIndex,size_t to)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  int *piVar6;
  undefined8 uVar7;
  uchar uVar8;
  void *pvVar9;
  
  uVar8 = this->nextFree;
  if (uVar8 == this->allocated) {
    addStorage(this);
    uVar8 = this->nextFree;
  }
  this->offsets[to] = uVar8;
  pEVar4 = this->entries;
  bVar2 = this->nextFree;
  this->nextFree = pEVar4[bVar2].storage.data[0];
  bVar3 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar5 = fromSpan->entries;
  uVar7 = *(undefined8 *)(pEVar5[bVar3].storage.data + 8);
  *(undefined8 *)pEVar4[bVar2].storage.data = *(undefined8 *)pEVar5[bVar3].storage.data;
  *(undefined8 *)(pEVar4[bVar2].storage.data + 8) = uVar7;
  *(undefined8 *)(pEVar4[bVar2].storage.data + 0x10) =
       *(undefined8 *)(pEVar5[bVar3].storage.data + 0x10);
  puVar1 = pEVar5[bVar3].storage.data + 8;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  *(undefined8 *)(pEVar4[bVar2].storage.data + 0x18) =
       *(undefined8 *)(pEVar5[bVar3].storage.data + 0x18);
  pEVar4 = pEVar5 + bVar3;
  (pEVar4->storage).data[0x18] = '\0';
  (pEVar4->storage).data[0x19] = '\0';
  (pEVar4->storage).data[0x1a] = '\0';
  (pEVar4->storage).data[0x1b] = '\0';
  (pEVar4->storage).data[0x1c] = '\0';
  (pEVar4->storage).data[0x1d] = '\0';
  (pEVar4->storage).data[0x1e] = '\0';
  (pEVar4->storage).data[0x1f] = '\0';
  piVar6 = *(int **)(pEVar5[bVar3].storage.data + 8);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      pvVar9 = *(void **)(pEVar5[bVar3].storage.data + 8);
      if (pvVar9 == (void *)0x0) {
        pvVar9 = (void *)0x0;
      }
      operator_delete(pvVar9);
    }
  }
  pEVar5[bVar3].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar3;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }